

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_color.hpp
# Opt level: O1

void __thiscall
optimization::graph_color::Conflict_Map::remove_edge_larger_colors(Conflict_Map *this)

{
  _Rb_tree_header *p_Var1;
  uint32_t uVar2;
  int iVar3;
  _Rb_tree_node_base *p_Var4;
  _Rb_tree_node_base *p_Var5;
  uint32_t uVar6;
  int iVar7;
  VarId local_50;
  VarId local_40;
  
  if ((this->edge_vars)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    p_Var5 = (this->edge_vars)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->edge_vars)._M_t._M_impl.super__Rb_tree_header;
    uVar6 = 0xffffffff;
    if ((_Rb_tree_header *)p_Var5 != p_Var1) {
      iVar7 = 9999999;
      do {
        for (p_Var4 = *(_Rb_tree_node_base **)(p_Var5 + 2);
            p_Var4 != (_Rb_tree_node_base *)&p_Var5[1]._M_left;
            p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
          uVar2 = *(uint32_t *)&p_Var4[1]._M_parent;
          local_50.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ee058;
          local_50.id = uVar2;
          iVar3 = get_priority(this,&local_50);
          if (iVar3 < iVar7) {
            iVar7 = iVar3;
            uVar6 = uVar2;
          }
        }
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
      } while ((_Rb_tree_header *)p_Var5 != p_Var1);
    }
    local_40.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ee058;
    local_40.id = uVar6;
    remove_node(this,&local_40,false);
  }
  return;
}

Assistant:

void remove_edge_larger_colors() {
    if (!edge_vars.size()) {
      return;
    }
    int priority = 9999999;
    // mir::inst::VarId var;
    // for (auto& pair : dynamic_Map) {
    //   if (get_priority(pair.first) < priority) {
    //     var = pair.first;
    //   }
    // }
    mir::inst::VarId var;
    for (auto& edgepair : edge_vars) {
      for (auto var1 : edgepair.second) {
        auto pri1 = get_priority(var1);
        if (pri1 < priority) {
          priority = pri1;
          var = var1;
        }
      }
    }
    remove_node(var, false);
  }